

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_msa(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGv_ptr pTVar1;
  uint uVar2;
  uintptr_t o_3;
  TCGv_i64 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  TCGv_i32 pTVar6;
  ulong uVar7;
  TCGv_i32 pTVar8;
  TCGv_i64 pTVar9;
  TCGv_i32 pTVar10;
  TCGContext_conflict6 *pTVar11;
  uint uVar12;
  uintptr_t o_26;
  int32_t val;
  DisasContext_conflict6 *ctx_00;
  code *pcVar13;
  uintptr_t o_2;
  int iVar14;
  uintptr_t o_189;
  uintptr_t o_1;
  uint uVar15;
  uintptr_t o;
  TCGTemp *pTVar16;
  long lStack_80;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGv_i32 local_58;
  TCGv_i32 local_50;
  TCGv_i32 local_48;
  TCGv_i32 local_40;
  uintptr_t o_326;
  
  pTVar11 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
  uVar12 = (uint)(env->active_tc).gpr[7] & 0xfc00003f;
  ctx_00 = (DisasContext_conflict6 *)0x20000000000;
  check_insn((DisasContext_conflict6 *)env,0x20000000000);
  check_msa_access((DisasContext_conflict6 *)env);
  switch(uVar12) {
  case 0x78000000:
  case 0x78000001:
  case 0x78000002:
    pTVar11 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar12 = (uint)(env->active_tc).gpr[7];
    pTVar5 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 6 & 0x1f);
    pTVar6 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0xb & 0x1f);
    pTVar8 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0x10 & 0xff);
    uVar12 = (uint)(env->active_tc).gpr[7];
    uVar2 = uVar12 & 0xff00003f;
    if (uVar2 != 0x7b000000) {
      if (uVar2 == 0x78000001) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_bmnzi_b_mips64el;
        goto LAB_008886b4;
      }
      if (uVar2 != 0x78000002) {
        if (uVar2 == 0x79000000) {
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_ori_b_mips64el;
        }
        else if (uVar2 == 0x79000001) {
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_bmzi_b_mips64el;
        }
        else {
          if (uVar2 == 0x79000002) goto LAB_008883a9;
          if (uVar2 == 0x7a000000) {
            local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
            pcVar13 = helper_msa_nori_b_mips64el;
          }
          else if (uVar2 == 0x7a000001) {
            local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
            pcVar13 = helper_msa_bseli_b_mips64el;
          }
          else {
            if (uVar2 == 0x7a000002) goto LAB_008883a9;
            if (uVar2 != 0x78000000) goto LAB_008883b4;
            local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
            pcVar13 = helper_msa_andi_b_mips64el;
          }
        }
        goto LAB_008886b4;
      }
LAB_008883a9:
      uVar12 = uVar12 >> 0x18 & 3;
      if (uVar12 == 3) {
LAB_008883b4:
        generate_exception_end((DisasContext_conflict6 *)env,0x14);
        break;
      }
      pTVar4 = tcg_const_i32_mips64el(pTVar11,uVar12);
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pTVar16 = (TCGTemp *)(pTVar4 + (long)pTVar11);
      local_58 = pTVar5 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar8 + (long)&pTVar11->pool_cur;
      local_60 = pTVar16;
      tcg_gen_callN_mips64el(pTVar11,helper_msa_shf_df_mips64el,(TCGTemp *)0x0,5,&local_68);
      goto LAB_00888432;
    }
    local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
    pcVar13 = helper_msa_xori_b_mips64el;
LAB_008886b4:
    local_50 = pTVar8 + (long)&pTVar11->pool_cur;
    local_58 = pTVar6 + (long)&pTVar11->pool_cur;
    local_60 = (TCGTemp *)(pTVar5 + (long)&pTVar11->pool_cur);
    tcg_gen_callN_mips64el(pTVar11,pcVar13,(TCGTemp *)0x0,4,&local_68);
    break;
  default:
switchD_00887bb3_caseD_78000003:
    generate_exception_end((DisasContext_conflict6 *)env,0x14);
    return;
  case 0x78000006:
  case 0x78000007:
    pTVar11 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar12 = (uint)(env->active_tc).gpr[7];
    local_40 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0x15 & 3);
    pTVar5 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 6 & 0x1f);
    pTVar8 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0xb & 0x1f);
    pTVar6 = tcg_temp_new_i32(pTVar11);
    tcg_gen_movi_i32(pTVar11,pTVar6,uVar12 >> 0x10 & 0x1f);
    uVar2 = (uint)(env->active_tc).gpr[7];
    uVar15 = uVar2 & 0xff80003f;
    if (uVar15 == 0x7b000007) {
      tcg_gen_movi_i32(pTVar11,pTVar6,(int)(uVar2 << 0xb) >> 0x16);
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
      local_58 = pTVar5 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_ldi_df_mips64el;
      iVar14 = 4;
      pTVar4 = local_40;
LAB_00888e4b:
      tcg_gen_callN_mips64el(pTVar11,pcVar13,(TCGTemp *)0x0,iVar14,&local_68);
    }
    else {
      iVar14 = (int)(uVar12 << 0xb) >> 0x1b;
      if (uVar15 == 0x78000007) {
        tcg_gen_movi_i32(pTVar11,pTVar6,iVar14);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_ceqi_df_mips64el;
        pTVar4 = local_40;
LAB_00888e49:
        iVar14 = 5;
        goto LAB_00888e4b;
      }
      pTVar4 = local_40;
      if (uVar15 == 0x78800006) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_subvi_df_mips64el;
        goto LAB_00888e49;
      }
      if (uVar15 == 0x79000006) {
        tcg_gen_movi_i32(pTVar11,pTVar6,iVar14);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_maxi_s_df_mips64el;
        pTVar4 = local_40;
        goto LAB_00888e49;
      }
      if (uVar15 == 0x79000007) {
        tcg_gen_movi_i32(pTVar11,pTVar6,iVar14);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_clti_s_df_mips64el;
        pTVar4 = local_40;
        goto LAB_00888e49;
      }
      if (uVar15 == 0x79800006) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_maxi_u_df_mips64el;
        goto LAB_00888e49;
      }
      if (uVar15 == 0x79800007) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_clti_u_df_mips64el;
        goto LAB_00888e49;
      }
      if (uVar15 == 0x7a000006) {
        tcg_gen_movi_i32(pTVar11,pTVar6,iVar14);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_mini_s_df_mips64el;
        pTVar4 = local_40;
        goto LAB_00888e49;
      }
      if (uVar15 == 0x7a000007) {
        tcg_gen_movi_i32(pTVar11,pTVar6,iVar14);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_clei_s_df_mips64el;
        pTVar4 = local_40;
        goto LAB_00888e49;
      }
      if (uVar15 == 0x7a800006) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_mini_u_df_mips64el;
        goto LAB_00888e49;
      }
      if (uVar15 == 0x7a800007) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_clei_u_df_mips64el;
        goto LAB_00888e49;
      }
      if (uVar15 == 0x78000006) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_60 = (TCGTemp *)(local_40 + (long)&pTVar11->pool_cur);
        local_58 = pTVar5 + (long)&pTVar11->pool_cur;
        local_50 = pTVar8 + (long)&pTVar11->pool_cur;
        local_48 = pTVar6 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_addvi_df_mips64el;
        goto LAB_00888e49;
      }
LAB_00888e86:
      generate_exception_end((DisasContext_conflict6 *)env,0x14);
    }
    tcg_temp_free_internal_mips64el(pTVar11,(TCGTemp *)(pTVar4 + (long)pTVar11));
    tcg_temp_free_internal_mips64el(pTVar11,(TCGTemp *)(pTVar5 + (long)pTVar11));
    pTVar16 = (TCGTemp *)(pTVar8 + (long)pTVar11);
    goto LAB_00889f00;
  case 0x78000009:
  case 0x7800000a:
    pTVar11 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar12 = (uint)(env->active_tc).gpr[7];
    if ((uVar12 >> 0x16 & 1) == 0) {
      val = 3;
      uVar2 = 0x3f;
    }
    else if ((uVar12 & 0x600000) == 0x400000) {
      val = 2;
      uVar2 = 0x1f;
    }
    else if ((uVar12 & 0x700000) == 0x600000) {
      val = 1;
      uVar2 = 0xf;
    }
    else {
      if ((uVar12 & 0x780000) != 0x700000) goto switchD_00887bb3_caseD_78000003;
      val = 0;
      uVar2 = 7;
    }
    pTVar4 = tcg_const_i32_mips64el(pTVar11,val);
    pTVar5 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0x10 & uVar2);
    pTVar8 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 6 & 0x1f);
    pTVar6 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0xb & 0x1f);
    uVar12 = (uint)(env->active_tc).gpr[7] & 0xff80003f;
    if (uVar12 == 0x7b800009) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_binsri_df_mips64el;
    }
    else if (uVar12 == 0x7800000a) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_sat_s_df_mips64el;
    }
    else if (uVar12 == 0x78800009) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_srai_df_mips64el;
    }
    else if (uVar12 == 0x7880000a) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_sat_u_df_mips64el;
    }
    else if (uVar12 == 0x79000009) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_srli_df_mips64el;
    }
    else if (uVar12 == 0x7900000a) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_srari_df_mips64el;
    }
    else if (uVar12 == 0x79800009) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_bclri_df_mips64el;
    }
    else if (uVar12 == 0x7980000a) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_srlri_df_mips64el;
    }
    else if (uVar12 == 0x7a000009) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_bseti_df_mips64el;
    }
    else if (uVar12 == 0x7a800009) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_bnegi_df_mips64el;
    }
    else if (uVar12 == 0x7b000009) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_binsli_df_mips64el;
    }
    else {
      if (uVar12 != 0x78000009) goto LAB_00888e86;
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      pcVar13 = helper_msa_slli_df_mips64el;
    }
    goto LAB_00888e49;
  case 0x7800000d:
  case 0x7800000e:
  case 0x7800000f:
  case 0x78000010:
  case 0x78000011:
  case 0x78000012:
  case 0x78000013:
  case 0x78000014:
  case 0x78000015:
    gen_msa_3r(env,ctx_00);
    return;
  case 0x78000019:
    uVar12 = (uint)(env->active_tc).gpr[7];
    if ((uVar12 & 0x300000) == 0) {
      uVar2 = 0xf;
      lStack_80 = 0;
    }
    else if ((uVar12 & 0x380000) == 0x200000) {
      lStack_80 = 1;
      uVar2 = 7;
    }
    else if ((uVar12 & 0x3c0000) == 0x300000) {
      uVar2 = 3;
      lStack_80 = 2;
    }
    else {
      if ((uVar12 & 0x3e0000) != 0x380000) {
        if ((uVar12 & 0x3f0000) != 0x3e0000) goto switchD_00887bb3_caseD_78000003;
        pTVar11 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
        uVar2 = uVar12 >> 0xb & 0x1f;
        uVar15 = uVar12 >> 6 & 0x1f;
        pTVar3 = tcg_temp_new_i64(pTVar11);
        pTVar4 = tcg_const_i32_mips64el(pTVar11,uVar2);
        pTVar5 = tcg_const_i32_mips64el(pTVar11,uVar15);
        uVar12 = (uint)(env->active_tc).gpr[7] & 0xffff003f;
        if (uVar12 == 0x78be0019) {
          pTVar1 = pTVar11->cpu_env;
          pcVar13 = helper_msa_move_v_mips64el;
          pTVar9 = (TCGv_i64)pTVar5;
          local_58 = pTVar4;
LAB_0088a26c:
          local_58 = local_58 + (long)&pTVar11->pool_cur;
          local_60 = (TCGTemp *)(pTVar9 + (long)&pTVar11->pool_cur);
          local_68 = (TCGTemp *)(pTVar1 + (long)pTVar11);
          tcg_gen_callN_mips64el(pTVar11,pcVar13,(TCGTemp *)0x0,3,&local_68);
        }
        else if (uVar12 == 0x787e0019) {
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
          tcg_gen_callN_mips64el
                    (pTVar11,helper_msa_cfcmsa_mips64el,
                     (TCGTemp *)(pTVar3 + (long)&pTVar11->pool_cur),2,&local_68);
          gen_store_gpr(pTVar11,pTVar3,uVar15);
        }
        else {
          if (uVar12 == 0x783e0019) {
            gen_load_gpr(pTVar11,pTVar3,uVar2);
            pTVar1 = pTVar11->cpu_env;
            pcVar13 = helper_msa_ctcmsa_mips64el;
            pTVar9 = pTVar3;
            local_58 = pTVar5;
            goto LAB_0088a26c;
          }
          generate_exception_end((DisasContext_conflict6 *)env,0x14);
        }
        tcg_temp_free_internal_mips64el(pTVar11,(TCGTemp *)(pTVar3 + (long)pTVar11));
        tcg_temp_free_internal_mips64el(pTVar11,(TCGTemp *)(pTVar5 + (long)pTVar11));
        pTVar16 = (TCGTemp *)(pTVar4 + (long)pTVar11);
        goto LAB_00889f0e;
      }
      lStack_80 = 3;
      uVar2 = 1;
    }
    pTVar11 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar15 = uVar12 >> 6 & 0x1f;
    local_40 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0xb & 0x1f);
    pTVar5 = tcg_const_i32_mips64el(pTVar11,uVar15);
    pTVar6 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0x10 & uVar2);
    o_326 = (uintptr_t)tcg_const_i32_mips64el(pTVar11,(int32_t)lStack_80);
    pTVar4 = local_40;
    uVar12 = (uint)(env->active_tc).gpr[7] & 0xffc0003f;
    switch((ulong)uVar12 - 0x78000019 << 0x2a | (ulong)uVar12 - 0x78000019 >> 0x16) {
    case 0:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_sldi_df_mips64el;
      break;
    case 1:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_splati_df_mips64el;
      break;
    case 2:
    case 3:
    case 4:
      if (uVar12 == 0x79000019) {
        (*(code *)(&DAT_00bac998 + *(int *)(&DAT_00bac998 + lStack_80 * 4)))();
        return;
      }
      if (uVar12 == 0x78c00019) {
        if (uVar15 != 0) {
          (*(code *)(&DAT_00bac9a8 + *(int *)(&DAT_00bac9a8 + lStack_80 * 4)))();
          return;
        }
      }
      else if ((uVar12 == 0x78800019) && (uVar15 != 0)) {
        (*(code *)(&DAT_00bac9b8 + *(int *)(&DAT_00bac9b8 + lStack_80 * 4)))();
        return;
      }
      goto LAB_0088a0f4;
    case 5:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_insve_df_mips64el;
      break;
    default:
      generate_exception_end((DisasContext_conflict6 *)env,0x14);
      pTVar4 = local_40;
      goto LAB_0088a0f4;
    }
    local_48 = pTVar6 + (long)&pTVar11->pool_cur;
    local_50 = local_40 + (long)&pTVar11->pool_cur;
    local_58 = pTVar5 + (long)pTVar11;
    local_60 = (TCGTemp *)(o_326 + (long)pTVar11);
    tcg_gen_callN_mips64el(pTVar11,pcVar13,(TCGTemp *)0x0,5,&local_68);
LAB_0088a0f4:
    tcg_temp_free_internal_mips64el(pTVar11,(TCGTemp *)(pTVar5 + (long)pTVar11));
    tcg_temp_free_internal_mips64el(pTVar11,(TCGTemp *)(pTVar4 + (long)pTVar11));
    tcg_temp_free_internal_mips64el(pTVar11,(TCGTemp *)(pTVar6 + (long)pTVar11));
    pTVar16 = (TCGTemp *)((long)&pTVar11->pool_cur + o_326);
    goto LAB_00889f0e;
  case 0x7800001a:
  case 0x7800001b:
  case 0x7800001c:
    pTVar11 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar12 = (uint)(env->active_tc).gpr[7];
    uVar2 = uVar12 >> 0x15 & 1;
    pTVar8 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 6 & 0x1f);
    pTVar4 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0xb & 0x1f);
    pTVar5 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0x10 & 0x1f);
    pTVar6 = tcg_temp_new_i32(pTVar11);
    tcg_gen_movi_i32(pTVar11,pTVar6,uVar2 + 2);
    uVar12 = (uint)(env->active_tc).gpr[7] & 0xffc0003f;
    if (uVar12 == 0x7bc0001b) {
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_fmax_a_df_mips64el;
LAB_00889ece:
      local_48 = pTVar5 + (long)&pTVar11->pool_cur;
      local_50 = pTVar4 + (long)&pTVar11->pool_cur;
      local_58 = pTVar8 + (long)&pTVar11->pool_cur;
      local_60 = (TCGTemp *)(pTVar6 + (long)&pTVar11->pool_cur);
      tcg_gen_callN_mips64el(pTVar11,pcVar13,(TCGTemp *)0x0,5,&local_68);
    }
    else {
      if (uVar12 == 0x7800001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fadd_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7840001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fcun_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7840001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fsub_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7840001c) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fcor_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7880001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fceq_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7880001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fmul_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7880001c) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fcune_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x78c0001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fcueq_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x78c0001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fdiv_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x78c0001c) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fcne_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7900001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fclt_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7900001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fmadd_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7900001c) {
        tcg_gen_movi_i32(pTVar11,pTVar6,uVar2 + 1);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_mul_q_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7940001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fcult_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7940001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fmsub_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7940001c) {
        tcg_gen_movi_i32(pTVar11,pTVar6,uVar2 + 1);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_madd_q_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7980001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fcle_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7980001c) {
        tcg_gen_movi_i32(pTVar11,pTVar6,uVar2 + 1);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_msub_q_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x79c0001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fcule_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x79c0001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fexp2_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7a00001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fsaf_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7a00001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fexdo_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7a40001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fsun_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7a40001c) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fsor_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7a80001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fseq_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7a80001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_ftq_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7a80001c) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fsune_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7ac0001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fsueq_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7ac0001c) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fsne_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7b00001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fslt_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7b00001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fmin_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7b00001c) {
        tcg_gen_movi_i32(pTVar11,pTVar6,uVar2 + 1);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_mulr_q_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7b40001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fsult_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7b40001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fmin_a_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7b40001c) {
        tcg_gen_movi_i32(pTVar11,pTVar6,uVar2 + 1);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_maddr_q_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7b80001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fsle_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7b80001b) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fmax_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7b80001c) {
        tcg_gen_movi_i32(pTVar11,pTVar6,uVar2 + 1);
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_msubr_q_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7bc0001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fsule_df_mips64el;
        goto LAB_00889ece;
      }
      if (uVar12 == 0x7800001a) {
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_fcaf_df_mips64el;
        goto LAB_00889ece;
      }
      generate_exception_end((DisasContext_conflict6 *)env,0x14);
    }
    pTVar16 = (TCGTemp *)(pTVar8 + (long)pTVar11);
LAB_00889ee4:
    tcg_temp_free_internal_mips64el(pTVar11,pTVar16);
LAB_00889ee9:
    tcg_temp_free_internal_mips64el(pTVar11,(TCGTemp *)(pTVar4 + (long)pTVar11));
    pTVar16 = (TCGTemp *)(pTVar5 + (long)pTVar11);
LAB_00889f00:
    tcg_temp_free_internal_mips64el(pTVar11,pTVar16);
    pTVar16 = (TCGTemp *)(pTVar6 + (long)pTVar11);
    goto LAB_00889f0e;
  case 0x7800001e:
    uVar12 = (uint)(env->active_tc).gpr[7];
    uVar2 = uVar12 & 0xffe0003f;
    if (((((uVar2 == 0x7800001e) || (uVar2 == 0x7820001e)) || (uVar2 == 0x7840001e)) ||
        ((uVar2 == 0x7860001e || (uVar2 == 0x7880001e)))) || (uVar2 == 0x78a0001e)) {
LAB_008882f5:
      pTVar11 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
      pTVar4 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 6 & 0x1f);
      pTVar5 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0xb & 0x1f);
      pTVar6 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0x10 & 0x1f);
      uVar7 = (ulong)((uint)(env->active_tc).gpr[7] & 0xffe0003f) - 0x7800001e;
      switch(uVar7 << 0x2b | uVar7 >> 0x15) {
      case 0:
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_and_v_mips64el;
        break;
      case 1:
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_or_v_mips64el;
        break;
      case 2:
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_nor_v_mips64el;
        break;
      case 3:
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_xor_v_mips64el;
        break;
      case 4:
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_bmnz_v_mips64el;
        break;
      case 5:
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_bmz_v_mips64el;
        break;
      case 6:
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        pcVar13 = helper_msa_bsel_v_mips64el;
        break;
      default:
        generate_exception_end((DisasContext_conflict6 *)env,0x14);
        goto LAB_00889ee9;
      }
      local_50 = pTVar6 + (long)&pTVar11->pool_cur;
      local_58 = pTVar5 + (long)&pTVar11->pool_cur;
      local_60 = (TCGTemp *)(pTVar4 + (long)&pTVar11->pool_cur);
      tcg_gen_callN_mips64el(pTVar11,pcVar13,(TCGTemp *)0x0,4,&local_68);
      goto LAB_00889ee9;
    }
    if (uVar2 != 0x7b20001e) {
      if (uVar2 != 0x7b00001e) {
        if (uVar2 != 0x78c0001e) goto switchD_00887bb3_caseD_78000003;
        goto LAB_008882f5;
      }
      pTVar11 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
      uVar2 = uVar12 >> 0x10 & 3;
      pTVar8 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 6 & 0x1f);
      pTVar4 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0xb & 0x1f);
      pTVar5 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0x10 & 0x1f);
      pTVar6 = tcg_const_i32_mips64el(pTVar11,uVar2);
      uVar7 = (ulong)((uint)(env->active_tc).gpr[7] & 0xfffc003f) - 0x7b00001e;
      switch(uVar7 << 0x2e | uVar7 >> 0x12) {
      case 0:
        local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
        local_50 = pTVar4 + (long)&pTVar11->pool_cur;
        pcVar13 = helper_msa_fill_df_mips64el;
        iVar14 = 4;
        pTVar10 = pTVar6;
        local_58 = pTVar8;
        goto LAB_0088a776;
      case 1:
        switch(uVar2) {
        case 0:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_pcnt_b_mips64el;
          break;
        case 1:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_pcnt_h_mips64el;
          break;
        case 2:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_pcnt_w_mips64el;
          break;
        case 3:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_pcnt_d_mips64el;
        }
        break;
      case 2:
        switch(uVar2) {
        case 0:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_nloc_b_mips64el;
          break;
        case 1:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_nloc_h_mips64el;
          break;
        case 2:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_nloc_w_mips64el;
          break;
        case 3:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_nloc_d_mips64el;
        }
        break;
      case 3:
        switch(uVar2) {
        case 0:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_nlzc_b_mips64el;
          break;
        case 1:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_nlzc_h_mips64el;
          break;
        case 2:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_nlzc_w_mips64el;
          break;
        case 3:
          local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
          pcVar13 = helper_msa_nlzc_d_mips64el;
        }
        break;
      default:
        generate_exception_end((DisasContext_conflict6 *)env,0x14);
        goto LAB_0088a781;
      }
      iVar14 = 3;
      pTVar10 = pTVar8;
      local_58 = pTVar4;
LAB_0088a776:
      local_58 = local_58 + (long)&pTVar11->pool_cur;
      local_60 = (TCGTemp *)(pTVar10 + (long)&pTVar11->pool_cur);
      tcg_gen_callN_mips64el(pTVar11,pcVar13,(TCGTemp *)0x0,iVar14,&local_68);
LAB_0088a781:
      pTVar16 = (TCGTemp *)(pTVar8 + (long)pTVar11);
      goto LAB_00889ee4;
    }
    pTVar11 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    pTVar4 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 6 & 0x1f);
    pTVar5 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0xb & 0x1f);
    pTVar6 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0x10 & 0x1f);
    pTVar8 = tcg_const_i32_mips64el(pTVar11,uVar12 >> 0x10 & 1 | 2);
    uVar7 = (ulong)((uint)(env->active_tc).gpr[7] & 0xfffe003f) - 0x7b20001e;
    switch(uVar7 << 0x2f | uVar7 >> 0x11) {
    case 0:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_fclass_df_mips64el;
      break;
    case 1:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_ftrunc_s_df_mips64el;
      break;
    case 2:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_ftrunc_u_df_mips64el;
      break;
    case 3:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_fsqrt_df_mips64el;
      break;
    case 4:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_frsqrt_df_mips64el;
      break;
    case 5:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_frcp_df_mips64el;
      break;
    case 6:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_frint_df_mips64el;
      break;
    case 7:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_flog2_df_mips64el;
      break;
    case 8:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_fexupl_df_mips64el;
      break;
    case 9:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_fexupr_df_mips64el;
      break;
    case 10:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_ffql_df_mips64el;
      break;
    case 0xb:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_ffqr_df_mips64el;
      break;
    case 0xc:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_ftint_s_df_mips64el;
      break;
    case 0xd:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_ftint_u_df_mips64el;
      break;
    case 0xe:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_ffint_s_df_mips64el;
      break;
    case 0xf:
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      pcVar13 = helper_msa_ffint_u_df_mips64el;
      break;
    default:
      goto switchD_008890d9_default;
    }
    local_50 = pTVar5 + (long)&pTVar11->pool_cur;
    local_58 = pTVar4 + (long)&pTVar11->pool_cur;
    local_60 = (TCGTemp *)(pTVar8 + (long)&pTVar11->pool_cur);
    tcg_gen_callN_mips64el(pTVar11,pcVar13,(TCGTemp *)0x0,4,&local_68);
switchD_008890d9_default:
    pTVar16 = (TCGTemp *)(pTVar4 + (long)pTVar11);
LAB_00888432:
    tcg_temp_free_internal_mips64el(pTVar11,pTVar16);
    break;
  case 0x78000020:
  case 0x78000021:
  case 0x78000022:
  case 0x78000023:
  case 0x78000024:
  case 0x78000025:
  case 0x78000026:
  case 0x78000027:
    uVar2 = (uint)(env->active_tc).gpr[7];
    tcg_const_i32_mips64el(pTVar11,uVar2 >> 6 & 0x1f);
    pTVar3 = tcg_temp_new_i64(pTVar11);
    gen_base_offset_addr
              ((DisasContext_conflict6 *)env,pTVar3,uVar2 >> 0xb & 0x1f,
               ((int)(uVar2 << 6) >> 0x16) << ((byte)uVar2 & 3));
    (*(code *)(&DAT_00bac8c4 + *(int *)(&DAT_00bac8c4 + (ulong)(uVar12 + 0x87ffffe0) * 4)))();
    return;
  }
  tcg_temp_free_internal_mips64el(pTVar11,(TCGTemp *)(pTVar5 + (long)pTVar11));
  tcg_temp_free_internal_mips64el(pTVar11,(TCGTemp *)(pTVar6 + (long)pTVar11));
  pTVar16 = (TCGTemp *)(pTVar8 + (long)pTVar11);
LAB_00889f0e:
  tcg_temp_free_internal_mips64el(pTVar11,pTVar16);
  return;
}

Assistant:

static void gen_msa(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t opcode = ctx->opcode;
    check_insn(ctx, ASE_MSA);
    check_msa_access(ctx);

    switch (MASK_MSA_MINOR(opcode)) {
    case OPC_MSA_I8_00:
    case OPC_MSA_I8_01:
    case OPC_MSA_I8_02:
        gen_msa_i8(env, ctx);
        break;
    case OPC_MSA_I5_06:
    case OPC_MSA_I5_07:
        gen_msa_i5(env, ctx);
        break;
    case OPC_MSA_BIT_09:
    case OPC_MSA_BIT_0A:
        gen_msa_bit(env, ctx);
        break;
    case OPC_MSA_3R_0D:
    case OPC_MSA_3R_0E:
    case OPC_MSA_3R_0F:
    case OPC_MSA_3R_10:
    case OPC_MSA_3R_11:
    case OPC_MSA_3R_12:
    case OPC_MSA_3R_13:
    case OPC_MSA_3R_14:
    case OPC_MSA_3R_15:
        gen_msa_3r(env, ctx);
        break;
    case OPC_MSA_ELM:
        gen_msa_elm(env, ctx);
        break;
    case OPC_MSA_3RF_1A:
    case OPC_MSA_3RF_1B:
    case OPC_MSA_3RF_1C:
        gen_msa_3rf(env, ctx);
        break;
    case OPC_MSA_VEC:
        gen_msa_vec(env, ctx);
        break;
    case OPC_LD_B:
    case OPC_LD_H:
    case OPC_LD_W:
    case OPC_LD_D:
    case OPC_ST_B:
    case OPC_ST_H:
    case OPC_ST_W:
    case OPC_ST_D:
        {
            int32_t s10 = sextract32(ctx->opcode, 16, 10);
            uint8_t rs = (ctx->opcode >> 11) & 0x1f;
            uint8_t wd = (ctx->opcode >> 6) & 0x1f;
            uint8_t df = (ctx->opcode >> 0) & 0x3;

            TCGv_i32 twd = tcg_const_i32(tcg_ctx, wd);
            TCGv taddr = tcg_temp_new(tcg_ctx);
            gen_base_offset_addr(ctx, taddr, rs, s10 << df);

            switch (MASK_MSA_MINOR(opcode)) {
            case OPC_LD_B:
                gen_helper_msa_ld_b(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_H:
                gen_helper_msa_ld_h(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_W:
                gen_helper_msa_ld_w(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_D:
                gen_helper_msa_ld_d(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_B:
                gen_helper_msa_st_b(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_H:
                gen_helper_msa_st_h(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_W:
                gen_helper_msa_st_w(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_D:
                gen_helper_msa_st_d(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            }

            tcg_temp_free_i32(tcg_ctx, twd);
            tcg_temp_free(tcg_ctx, taddr);
        }
        break;
    default:
        MIPS_INVAL("MSA instruction");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }

}